

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

IdentifierPath * __thiscall
soul::IdentifierPath::getParentPath(IdentifierPath *__return_storage_ptr__,IdentifierPath *this)

{
  size_t sVar1;
  IdentifierPath *this_local;
  IdentifierPath *p;
  
  sVar1 = size(this);
  if (sVar1 < 2) {
    IdentifierPath(__return_storage_ptr__);
  }
  else {
    IdentifierPath(__return_storage_ptr__,this);
    ArrayWithPreallocation<soul::Identifier,_8UL>::pop_back(&__return_storage_ptr__->pathSections);
  }
  return __return_storage_ptr__;
}

Assistant:

IdentifierPath getParentPath() const
    {
        if (size() <= 1)
            return {};

        auto p = *this;
        p.pathSections.pop_back();
        return p;
    }